

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_backend.c
# Opt level: O0

int ossl_dh_key_fromdata(DH *dh,OSSL_PARAM *params)

{
  int iVar1;
  OSSL_PARAM *pOVar2;
  OSSL_PARAM *p;
  long in_RDI;
  BIGNUM *pub_key;
  BIGNUM *priv_key;
  OSSL_PARAM *param_pub_key;
  OSSL_PARAM *param_priv_key;
  BIGNUM *pub_key_00;
  DH *dh_00;
  int local_4;
  
  dh_00 = (DH *)0x0;
  pub_key_00 = (BIGNUM *)0x0;
  if (in_RDI == 0) {
    local_4 = 0;
  }
  else {
    pOVar2 = OSSL_PARAM_locate_const((OSSL_PARAM *)0x0,(char *)0x0);
    p = OSSL_PARAM_locate_const((OSSL_PARAM *)dh_00,(char *)pub_key_00);
    if ((((pOVar2 == (OSSL_PARAM *)0x0) ||
         (iVar1 = OSSL_PARAM_get_BN(p,(BIGNUM **)dh_00), iVar1 != 0)) &&
        ((p == (OSSL_PARAM *)0x0 || (iVar1 = OSSL_PARAM_get_BN(p,(BIGNUM **)dh_00), iVar1 != 0))))
       && (iVar1 = DH_set0_key(dh_00,(BIGNUM *)pub_key_00,(BIGNUM *)0x3b6f1b), iVar1 != 0)) {
      local_4 = 1;
    }
    else {
      BN_clear_free((BIGNUM *)dh_00);
      BN_free(pub_key_00);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ossl_dh_key_fromdata(DH *dh, const OSSL_PARAM params[])
{
    const OSSL_PARAM *param_priv_key, *param_pub_key;
    BIGNUM *priv_key = NULL, *pub_key = NULL;

    if (dh == NULL)
        return 0;

    param_priv_key = OSSL_PARAM_locate_const(params, OSSL_PKEY_PARAM_PRIV_KEY);
    param_pub_key = OSSL_PARAM_locate_const(params, OSSL_PKEY_PARAM_PUB_KEY);

    if ((param_priv_key != NULL
         && !OSSL_PARAM_get_BN(param_priv_key, &priv_key))
        || (param_pub_key != NULL
            && !OSSL_PARAM_get_BN(param_pub_key, &pub_key)))
        goto err;

    if (!DH_set0_key(dh, pub_key, priv_key))
        goto err;

    return 1;

 err:
    BN_clear_free(priv_key);
    BN_free(pub_key);
    return 0;
}